

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ulong in_RAX;
  ostream *poVar1;
  char ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  do {
    InitVariables();
    GetInput();
    CalcInfo();
    CreateCache();
    FileTest();
    PrintOutput();
    poVar1 = std::operator<<((ostream *)&std::cout,"Continue/Exit(C/E)");
    std::endl<char,std::char_traits<char>>(poVar1);
    std::operator>>((istream *)&std::cin,(char *)((long)&uStack_28 + 7));
  } while ((uStack_28._7_1_ & 0xdf) != 0x45);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	char ch = '\0';

	do
	{
		InitVariables();
		GetInput();
		CalcInfo();
		CreateCache();
		FileTest();
		PrintOutput();
		std::cout << "Continue/Exit(C/E)" << std::endl;
		std::cin >> ch;
	} while ((ch != 'e') && (ch != 'E'));

	return 0;
}